

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall jsonnet::internal::PrettyFieldNames::visit(PrettyFieldNames *this,Object *expr)

{
  pointer pOVar1;
  bool bVar2;
  Kind KVar3;
  long lVar4;
  Identifier *pIVar5;
  ObjectField *field;
  pointer pOVar6;
  Fodder *a;
  
  pOVar1 = (expr->fields).
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pOVar6 = (expr->fields).
                super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                ._M_impl.super__Vector_impl_data._M_start; pOVar6 != pOVar1; pOVar6 = pOVar6 + 1) {
    KVar3 = pOVar6->kind;
    if (KVar3 == FIELD_EXPR) {
      if (pOVar6->expr1 != (AST *)0x0) {
        lVar4 = __dynamic_cast(pOVar6->expr1,&AST::typeinfo,&LiteralString::typeinfo,0);
        if (lVar4 != 0) {
          pOVar6->kind = FIELD_STR;
          fodder_move_front((Fodder *)(lVar4 + 0x50),&pOVar6->fodder1);
          a = &pOVar6->fodderL;
          if (pOVar6->methodSugar == false) {
            a = &pOVar6->opFodder;
          }
          fodder_move_front(a,&pOVar6->fodder2);
        }
      }
      KVar3 = pOVar6->kind;
    }
    if ((KVar3 == FIELD_STR) && (pOVar6->expr1 != (AST *)0x0)) {
      lVar4 = __dynamic_cast(pOVar6->expr1,&AST::typeinfo,&LiteralString::typeinfo,0);
      if (lVar4 != 0) {
        bVar2 = isIdentifier(this,(UString *)(lVar4 + 0x80));
        if (bVar2) {
          pOVar6->kind = FIELD_ID;
          pIVar5 = Allocator::makeIdentifier
                             ((this->super_FmtPass).super_CompilerPass.alloc,
                              (UString *)(lVar4 + 0x80));
          pOVar6->id = pIVar5;
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(&pOVar6->fodder1,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)(lVar4 + 0x50));
          pOVar6->expr1 = (AST *)0x0;
        }
      }
    }
  }
  CompilerPass::visit((CompilerPass *)this,expr);
  return;
}

Assistant:

void visit(Object *expr)
    {
        for (auto &field : expr->fields) {
            // First try ["foo"] -> "foo".
            if (field.kind == ObjectField::FIELD_EXPR) {
                if (auto *field_expr = dynamic_cast<LiteralString *>(field.expr1)) {
                    field.kind = ObjectField::FIELD_STR;
                    fodder_move_front(field_expr->openFodder, field.fodder1);
                    if (field.methodSugar) {
                        fodder_move_front(field.fodderL, field.fodder2);
                    } else {
                        fodder_move_front(field.opFodder, field.fodder2);
                    }
                }
            }
            // Then try "foo" -> foo.
            if (field.kind == ObjectField::FIELD_STR) {
                if (auto *lit = dynamic_cast<LiteralString *>(field.expr1)) {
                    if (isIdentifier(lit->value)) {
                        field.kind = ObjectField::FIELD_ID;
                        field.id = alloc.makeIdentifier(lit->value);
                        field.fodder1 = lit->openFodder;
                        field.expr1 = nullptr;
                    }
                }
            }
        }
        FmtPass::visit(expr);
    }